

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ptr<Statement> __thiscall Parser::continueStatement(Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  ptr<Statement> pVar1;
  shared_ptr<ContinueStatement> local_28;
  Parser *this_local;
  
  this_local = this;
  if (in_RSI->functionCounter == 0) {
    error(in_RSI,"Unexpected \'continue\' outside a function.");
  }
  consume(in_RSI);
  consume(in_RSI,StatEnd,"\';\'");
  make<ContinueStatement>();
  std::shared_ptr<Statement>::shared_ptr<ContinueStatement,void>
            ((shared_ptr<Statement> *)this,&local_28);
  std::shared_ptr<ContinueStatement>::~shared_ptr(&local_28);
  pVar1.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar1.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::continueStatement() {
    if(functionCounter == 0)
        error("Unexpected 'continue' outside a function.");

    consume();
    consume(TokenType::StatEnd, "';'");
    return make<ContinueStatement>();
}